

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cpp
# Opt level: O2

string * __thiscall
higan::System::RunShellCommand
          (string *__return_storage_ptr__,System *this,string *command,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          args)

{
  string *psVar1;
  FILE *__stream;
  char *pcVar2;
  long lVar3;
  string *arg;
  char local_458 [8];
  char buff [1024];
  char *local_50;
  string run_command;
  
  std::__cxx11::string::string((string *)&local_50,(string *)this);
  for (lVar3 = (long)args._M_array << 5; lVar3 != 0; lVar3 = lVar3 + -0x20) {
    psVar1 = (string *)std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::append(psVar1);
  }
  __stream = popen(local_50,"r");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    pcVar2 = fgets(local_458,0x400,__stream);
    if (pcVar2 == (char *)0x0) break;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string System::RunShellCommand(std::string command, std::initializer_list<std::string> args)
{
	std::string run_command = std::move(command);

	for (const std::string& arg : args)
	{
		run_command.append(" ").append(arg); // difference between operator+ and append
	}

	FILE* ret_stream = popen(run_command.c_str(), "r");

	char buff[1024];
	std::string result;
	while (fgets(buff, sizeof buff, ret_stream) != nullptr)
	{
		result.append(buff);
	}

	return result;
}